

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O0

void __thiscall lzham::semaphore::release(semaphore *this,long releaseCount)

{
  long in_RSI;
  sem_t *in_RDI;
  int status;
  uint in_stack_000001d4;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  while ((0 < local_10 && (local_14 = sem_post(in_RDI), local_14 == 0))) {
    local_10 = local_10 + -1;
  }
  if (local_14 != 0) {
    lzham_fail(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4);
  }
  return;
}

Assistant:

inline void release(long releaseCount = 1)
      {
         LZHAM_ASSERT(releaseCount >= 1);

         int status;
#ifdef WIN32
         if (1 == releaseCount)
            status = sem_post(&m_sem);
         else
            status = sem_post_multiple(&m_sem, releaseCount);
#else
         while (releaseCount > 0)
         {
            status = sem_post(&m_sem);
            if (status)
               break;
            releaseCount--;
         }
#endif

         if (status)
         {
            LZHAM_FAIL("semaphore: sem_post() or sem_post_multiple() failed");
         }
      }